

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort key;
  uint uVar1;
  roaring_array_t *ra;
  container_t *pcVar2;
  ushort *puVar3;
  roaring_bitmap_t *prVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  ushort key_00;
  int iVar8;
  uint start_index;
  ulong uVar9;
  roaring_array_t *prVar10;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_57;
  uint8_t local_56;
  uint8_t local_55;
  uint local_54;
  roaring_array_t *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_55 = '\0';
  uVar7 = (x1->high_low_container).size;
  prVar4 = x2;
  if (uVar7 != 0) {
    uVar1 = (x2->high_low_container).size;
    local_48 = (ulong)uVar1;
    prVar4 = x1;
    if (uVar1 != 0) {
      ra = &roaring_bitmap_create_with_capacity(uVar1 + uVar7)->high_low_container;
      bVar6 = 1;
      if (((x1->high_low_container).flags & 1) == 0) {
        bVar6 = (x2->high_low_container).flags & 1;
      }
      ra->flags = ra->flags & 0xfe | bVar6;
      key_00 = *(x1->high_low_container).keys;
      puVar3 = (x2->high_low_container).keys;
      local_40 = (ulong)(uVar7 - 1);
      local_54 = 0;
      uVar9 = 0;
      local_50 = &x2->high_low_container;
      local_38 = (ulong)uVar7;
LAB_001049a8:
      do {
        key = *puVar3;
        uVar9 = (ulong)(int)uVar9;
        while( true ) {
          prVar10 = local_50;
          uVar7 = local_54;
          iVar8 = (int)uVar9;
          if (key_00 == key) break;
          if (key <= key_00) {
            local_57 = local_50->typecodes[(ushort)local_54];
            pcVar2 = get_copy_of_container
                               (local_50->containers[(ushort)local_54],&local_57,
                                (_Bool)(local_50->flags & 1));
            if ((prVar10->flags & 1) != 0) {
              prVar10->containers[(int)local_54] = pcVar2;
              prVar10->typecodes[(int)local_54] = local_57;
            }
            ra_append(ra,key,pcVar2,local_57);
            uVar5 = local_54 + 1;
            uVar7 = (uint)local_48;
            uVar1 = uVar7;
            if (uVar5 == uVar7) goto LAB_00104bba;
            puVar3 = (ushort *)((ulong)((uVar5 & 0xffff) * 2) + (long)prVar10->keys);
            local_54 = uVar5;
            goto LAB_001049a8;
          }
          local_56 = (x1->high_low_container).typecodes[uVar9 & 0xffff];
          pcVar2 = get_copy_of_container
                             ((x1->high_low_container).containers[uVar9 & 0xffff],&local_56,
                              (_Bool)((x1->high_low_container).flags & 1));
          if (((x1->high_low_container).flags & 1) != 0) {
            (x1->high_low_container).containers[uVar9] = pcVar2;
            (x1->high_low_container).typecodes[uVar9] = local_56;
          }
          ra_append(ra,key_00,pcVar2,local_56);
          if ((int)local_40 == iVar8) {
            uVar1 = (uint)local_48;
            prVar10 = local_50;
            uVar7 = local_54;
            goto LAB_00104b6b;
          }
          uVar9 = uVar9 + 1;
          key_00 = (x1->high_low_container).keys[uVar9 & 0xffff];
        }
        local_56 = (x1->high_low_container).typecodes[uVar9 & 0xffff];
        local_57 = local_50->typecodes[local_54 & 0xffff];
        pcVar2 = container_or((x1->high_low_container).containers[uVar9 & 0xffff],local_56,
                              local_50->containers[local_54 & 0xffff],local_57,&local_55);
        ra_append(ra,key_00,pcVar2,local_55);
        uVar7 = uVar7 + 1;
        if (((int)local_40 == iVar8) || (uVar7 == (uint)local_48)) {
          uVar9 = (ulong)(iVar8 + 1);
          prVar10 = local_50;
          uVar1 = (uint)local_48;
LAB_00104bba:
          start_index = (uint)uVar9;
          uVar5 = (uint)local_38;
          if (start_index == uVar5) {
LAB_00104b6b:
            x1 = (roaring_bitmap_t *)prVar10;
            bVar6 = (x1->high_low_container).flags;
            uVar5 = uVar1;
            start_index = uVar7;
          }
          else {
            if (uVar7 != uVar1) {
              return (roaring_bitmap_t *)ra;
            }
            bVar6 = (x1->high_low_container).flags;
          }
          ra_append_copy_range(ra,&x1->high_low_container,start_index,uVar5,(_Bool)(bVar6 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar9 = uVar9 + 1;
        key_00 = (x1->high_low_container).keys[(uint)uVar9 & 0xffff];
        puVar3 = (ushort *)((ulong)((uVar7 & 0xffff) * 2) + (long)local_50->keys);
        local_54 = uVar7;
      } while( true );
    }
  }
  prVar4 = roaring_bitmap_copy(prVar4);
  return prVar4;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or(const roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c = container_or(c1, type1, c2, type2, &result_type);

            // since we assume that the initial containers are non-empty, the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            // c1 = container_clone(c1, type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            // c2 = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}